

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
          (StreamingConcatenationExpression *this,ConstraintExprVisitor *visitor)

{
  StreamExpression *stream;
  pointer pSVar1;
  long lVar2;
  
  pSVar1 = (this->streams_)._M_ptr;
  for (lVar2 = (this->streams_)._M_extent._M_extent_value * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18)
  {
    Expression::visit<slang::ast::ConstraintExprVisitor&>((pSVar1->operand).ptr,visitor);
    if (pSVar1->withExpr != (Expression *)0x0) {
      Expression::visit<slang::ast::ConstraintExprVisitor&>(pSVar1->withExpr,visitor);
    }
    pSVar1 = pSVar1 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& stream : streams()) {
            stream.operand->visit(visitor);
            if (stream.withExpr)
                stream.withExpr->visit(visitor);
        }
    }